

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gl4cBufferStorageTests.cpp
# Opt level: O0

char * __thiscall
gl4cts::BufferStorage::MapPersistentTextureTest::getOperationName
          (MapPersistentTextureTest *this,TESTED_OPERATION operation)

{
  TestError *this_00;
  char *local_20;
  char *name;
  TESTED_OPERATION operation_local;
  MapPersistentTextureTest *this_local;
  
  switch(operation) {
  case OP_COMPRESSED_TEX_IMAGE:
    local_20 = "CompressedTexImage";
    break;
  case OP_COMPRESSED_TEX_SUB_IMAGE:
    local_20 = "CompressedTexSubImage";
    break;
  case OP_COMPRESSED_TEXTURE_SUB_IMAGE:
    local_20 = "CompressedTextureSubImage";
    break;
  case OP_TEX_IMAGE:
    local_20 = "TexImage";
    break;
  case OP_TEX_SUB_IMAGE:
    local_20 = "TexSubImage";
    break;
  default:
    this_00 = (TestError *)__cxa_allocate_exception(0x38);
    tcu::TestError::TestError
              (this_00,"Invalid enum",(char *)0x0,
               "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/gl/gl4cBufferStorageTests.cpp"
               ,0xa6c);
    __cxa_throw(this_00,&tcu::TestError::typeinfo,tcu::TestError::~TestError);
  }
  return local_20;
}

Assistant:

const char* MapPersistentTextureTest::getOperationName(TESTED_OPERATION operation)
{
	const char* name = 0;

	switch (operation)
	{
	case OP_COMPRESSED_TEX_IMAGE:
		name = "CompressedTexImage";
		break;
	case OP_COMPRESSED_TEX_SUB_IMAGE:
		name = "CompressedTexSubImage";
		break;
	case OP_COMPRESSED_TEXTURE_SUB_IMAGE:
		name = "CompressedTextureSubImage";
		break;
	case OP_TEX_IMAGE:
		name = "TexImage";
		break;
	case OP_TEX_SUB_IMAGE:
		name = "TexSubImage";
		break;
	default:
		TCU_FAIL("Invalid enum");
	}

	return name;
}